

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcCShapeProfileDef::IfcCShapeProfileDef(IfcCShapeProfileDef *this)

{
  IfcCShapeProfileDef *this_local;
  
  STEP::Object::Object((Object *)&this->field_0xc0,"IfcCShapeProfileDef");
  IfcParameterizedProfileDef::IfcParameterizedProfileDef
            (&this->super_IfcParameterizedProfileDef,&PTR_construction_vtable_24__01063100);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcCShapeProfileDef,_6UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcCShapeProfileDef,_6UL> *)
             &(this->super_IfcParameterizedProfileDef).field_0x70,
             &PTR_construction_vtable_24__01063148);
  (this->super_IfcParameterizedProfileDef).super_IfcProfileDef.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x1063070;
  *(undefined8 *)&this->field_0xc0 = 0x10630e8;
  *(undefined8 *)&(this->super_IfcParameterizedProfileDef).super_IfcProfileDef.field_0x58 =
       0x1063098;
  *(undefined8 *)&(this->super_IfcParameterizedProfileDef).field_0x70 = 0x10630c0;
  STEP::Maybe<double>::Maybe(&this->InternalFilletRadius);
  STEP::Maybe<double>::Maybe(&this->CentreOfGravityInX);
  return;
}

Assistant:

IfcCShapeProfileDef() : Object("IfcCShapeProfileDef") {}